

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
           *this,long *state,long *next)

{
  undefined8 uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  char *pcVar10;
  difference_type __d;
  uint uVar11;
  uint uVar12;
  int iVar13;
  
  uVar1 = *(undefined8 *)(this + 0x30);
  pcVar2 = (char *)*state;
  uVar12 = *(uint *)(this + 0x2c);
  pcVar8 = pcVar2;
  if (uVar12 == 0) {
    uVar12 = 0;
  }
  else {
    pcVar3 = *(char **)this;
    pcVar4 = *(char **)(this + 0x20);
    uVar11 = 0;
    pcVar5 = pcVar3;
    pcVar10 = pcVar2;
    pcVar7 = pcVar2;
joined_r0x0012f639:
    do {
      if (pcVar5 != pcVar4) {
        if (pcVar10 == (char *)state[4]) {
          *(undefined1 *)((long)state + 0x31) = 1;
        }
        else if (*pcVar10 == *pcVar5) {
          pcVar10 = pcVar10 + 1;
          *state = (long)pcVar10;
          pcVar5 = pcVar5 + 1;
          pcVar8 = pcVar10;
          goto joined_r0x0012f639;
        }
        *state = (long)pcVar7;
        pcVar8 = pcVar7;
        uVar12 = uVar11;
        break;
      }
      uVar11 = uVar11 + 1;
      pcVar5 = pcVar3;
      pcVar7 = pcVar10;
    } while (uVar11 != uVar12);
  }
  if (this[0x38] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
       )0x1) {
    if (*(uint *)(this + 0x2c) <= uVar12) {
      pcVar8 = pcVar2 + ((char *)state[4] != pcVar2);
    }
    if (uVar12 == 0) {
      pcVar8 = pcVar2 + ((char *)state[4] != pcVar2);
    }
    state[0x12] = (long)pcVar8;
  }
  if (uVar12 < *(uint *)(this + 0x28)) {
LAB_0012f6b9:
    *state = (long)pcVar2;
    bVar9 = false;
  }
  else {
    cVar6 = (**(code **)(*next + 0x10))(next,state);
    bVar9 = true;
    if (cVar6 == '\0') {
      iVar13 = uVar12 + 1;
      do {
        iVar13 = iVar13 + -1;
        if (iVar13 == *(int *)(this + 0x28)) goto LAB_0012f6b9;
        *state = *state + (long)-(int)uVar1;
        cVar6 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar6 == '\0');
    }
  }
  return bVar9;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }